

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_ptr_eq(void *a,void *b,char *testcase,int line)

{
  uint in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int err;
  
  test_counter = test_counter + 1;
  if ((in_RDI != in_RSI) == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
    printf("# Expected %p, but observed %p instead (line %d)\n",in_RDI,in_RSI,(ulong)in_ECX);
    global_err = global_err + 1;
  }
  return (uint)(in_RDI != in_RSI);
}

Assistant:

int assert_ptr_eq(const void* a, const void* b, const char *testcase, int line)
{
    test_counter++;
    int err = a!=b;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected %p, but observed %p instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}